

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O3

hrgls_Status hrgls_MessageDestroy(hrgls_Message obj)

{
  pointer pcVar1;
  
  if (obj != (hrgls_Message)0x0) {
    pcVar1 = (obj->value)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(obj->value).field_2) {
      operator_delete(pcVar1);
    }
    operator_delete(obj);
    return 0;
  }
  return 0x3ec;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_MessageDestroy(hrgls_Message obj)
  {
	  hrgls_Status s = hrgls_STATUS_OKAY;
	  if (!obj) {
		  return hrgls_STATUS_DELETE_OF_NULL_POINTER;
	  }
	  try {
		  delete obj;
	  } catch (...) {
		  s = hrgls_STATUS_DELETION_FAILED;
	  }
	  return s;
  }